

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData *
GenerateCpcSpeedlockTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  bool bVar1;
  int iVar2;
  Sector *pSVar3;
  Data *pDVar4;
  BitBuffer *bitstream;
  uchar local_1f9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f0;
  uchar *local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  undefined1 local_1d0 [8];
  Data data7;
  Sector *sector7;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  Data local_180;
  allocator<unsigned_char> local_161;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  Data local_148;
  byte local_129;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_128;
  bool is_weak;
  Data *data_copy;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  BitstreamTrackBuilder bitbuf;
  undefined1 local_70 [8];
  FluxTrackBuilder fluxbuf;
  int weak_size_local;
  int weak_offset_local;
  Track *track_local;
  CylHead *cylhead_local;
  TrackData *trackdata;
  
  fluxbuf._64_4_ = weak_size;
  fluxbuf._68_4_ = weak_offset;
  FluxTrackBuilder::FluxTrackBuilder((FluxTrackBuilder *)local_70,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_70,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)&__range1,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)&__range1,false);
  __end1 = Track::begin(track);
  sector = (Sector *)Track::end(track);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                     *)&sector), bVar1) {
    data_copy = (Data *)__gnu_cxx::
                        __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                        ::operator*(&__end1);
    pvStack_128 = &Sector::data_copy((Sector *)data_copy,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    pDVar4 = data_copy;
    pSVar3 = Track::operator[](track,7);
    local_129 = (Sector *)pDVar4 == pSVar3;
    if ((bool)local_129) {
      TrackBuilder::addSectorUpToData
                ((TrackBuilder *)local_70,(Header *)data_copy,
                 *(uint8_t *)
                  &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      local_150._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_128);
      local_160._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_128);
      local_158 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_160,(long)(int)fluxbuf._68_4_);
      std::allocator<unsigned_char>::allocator(&local_161);
      Data::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (&local_148,local_150,local_158,&local_161);
      TrackBuilder::addBlock((TrackBuilder *)local_70,&local_148);
      Data::~Data(&local_148);
      std::allocator<unsigned_char>::~allocator(&local_161);
      FluxTrackBuilder::addWeakBlock((FluxTrackBuilder *)local_70,fluxbuf._64_4_);
      local_198._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_128);
      local_190 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_198,(long)(int)fluxbuf._68_4_);
      local_188 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_190,(long)(int)fluxbuf._64_4_);
      local_1a8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_128);
      iVar2 = Sector::size((Sector *)data_copy);
      local_1a0 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1a8,(long)iVar2);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&sector7 + 7));
      Data::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (&local_180,local_188,local_1a0,(allocator<unsigned_char> *)((long)&sector7 + 7));
      TrackBuilder::addBlock((TrackBuilder *)local_70,&local_180);
      Data::~Data(&local_180);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&sector7 + 7));
    }
    else {
      TrackBuilder::addSector
                ((TrackBuilder *)local_70,(Header *)data_copy,(Data *)pvStack_128,0x54,
                 *(uint8_t *)
                  &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,false);
    }
    TrackBuilder::addSector
              ((TrackBuilder *)&__range1,(Header *)data_copy,(Data *)pvStack_128,0x2e,
               *(uint8_t *)
                &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(bool)(local_129 & 1));
    pDVar4 = data_copy;
    pSVar3 = Track::operator[](track,1);
    if ((Sector *)pDVar4 == pSVar3) {
      data7.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)Track::operator[](track,7);
      pDVar4 = Sector::data_copy((Sector *)
                                 data7.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      Data::Data((Data *)local_1d0,pDVar4);
      local_1e0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
      local_1d8 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1e0,(long)(int)fluxbuf._68_4_);
      local_1f8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
      local_1f0 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1f8,(long)(int)fluxbuf._68_4_);
      local_1e8 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_1f0,(long)(int)fluxbuf._64_4_);
      local_1f9 = 0xee;
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                (local_1d8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_1e8,&local_1f9);
      TrackBuilder::addSector
                ((TrackBuilder *)&__range1,
                 (Header *)
                 data7.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(Data *)local_1d0,0x2e,
                 data7.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0x20],true);
      Data::~Data((Data *)local_1d0);
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  TrackData::TrackData(__return_storage_ptr__,cylhead);
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)&__range1);
  TrackData::add(__return_storage_ptr__,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)&__range1);
  FluxTrackBuilder::~FluxTrackBuilder((FluxTrackBuilder *)local_70);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateCpcSpeedlockTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsCpcSpeedlockTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak{ &sector == &track[7] };

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 0x2e, sector.dam, is_weak);

        // Add duplicate weak sector half way around track.
        if (&sector == &track[1])
        {
            auto& sector7{ track[7] };
            auto data7{ sector7.data_copy() };
            std::fill(data7.begin() + weak_offset, data7.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sector7.header, data7, 0x2e, sector7.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}